

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2,SorterRecord **ppOut)

{
  uint uVar1;
  undefined8 *in_RCX;
  VdbeSorter *in_RDX;
  VdbeSorter *in_RSI;
  int res;
  void *pVal2;
  SorterRecord **pp;
  SorterRecord *pFinal;
  VdbeSorter *local_58;
  uint in_stack_ffffffffffffffb4;
  PmaReader **pKey2;
  int in_stack_ffffffffffffffc4;
  PmaReader **pKey1;
  SortSubtask *pTask_00;
  undefined1 local_28 [16];
  VdbeSorter *local_18;
  VdbeSorter *local_10;
  
  local_28._0_8_ = (SQLiteThread *)0x0;
  pTask_00 = (SortSubtask *)local_28;
  local_28._8_8_ = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX == (VdbeSorter *)0x0) {
    pKey2 = (PmaReader **)0x0;
    pKey1 = pKey2;
  }
  else {
    pKey2 = &in_RDX->pReader;
    pKey1 = pKey2;
  }
  while( true ) {
    uVar1 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (local_10 != (VdbeSorter *)0x0) {
      uVar1 = CONCAT13(local_18 != (VdbeSorter *)0x0,(int3)in_stack_ffffffffffffffb4);
    }
    in_stack_ffffffffffffffb4 = uVar1;
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
    in_stack_ffffffffffffffc4 =
         vdbeSorterCompare(pTask_00,pKey1,in_stack_ffffffffffffffc4,pKey2,in_stack_ffffffffffffffb4)
    ;
    if (in_stack_ffffffffffffffc4 < 1) {
      pTask_00->pThread = (SQLiteThread *)local_10;
      pTask_00 = (SortSubtask *)&local_10->mxKeysize;
      local_10 = *(VdbeSorter **)&local_10->mxKeysize;
      pKey1 = (PmaReader **)0x0;
    }
    else {
      pTask_00->pThread = (SQLiteThread *)local_18;
      pTask_00 = (SortSubtask *)&local_18->mxKeysize;
      local_18 = *(VdbeSorter **)&local_18->mxKeysize;
      if (local_18 == (VdbeSorter *)0x0) break;
      pKey1 = &local_18->pReader;
    }
  }
  if (local_10 == (VdbeSorter *)0x0) {
    local_58 = local_18;
  }
  else {
    local_58 = local_10;
  }
  pTask_00->pThread = (SQLiteThread *)local_58;
  *(undefined8 *)local_28._8_8_ = local_28._0_8_;
  return;
}

Assistant:

static void vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2,               /* Second list to merge */
  SorterRecord **ppOut            /* OUT: Head of merged list */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  void *pVal2 = p2 ? SRVAL(p2) : 0;

  while( p1 && p2 ){
    int res;
    res = vdbeSorterCompare(pTask, SRVAL(p1), p1->nVal, pVal2, p2->nVal);
    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      pVal2 = 0;
    }else{
      *pp = p2;
       pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      if( p2==0 ) break;
      pVal2 = SRVAL(p2);
    }
  }
  *pp = p1 ? p1 : p2;
  *ppOut = pFinal;
}